

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

void __thiscall duckdb::DuckTableScanState::~DuckTableScanState(DuckTableScanState *this)

{
  ~DuckTableScanState(this);
  operator_delete(this);
  return;
}

Assistant:

DuckTableScanState(ClientContext &context, const FunctionData *bind_data_p)
	    : TableScanGlobalState(context, bind_data_p) {
	}